

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O2

bool __thiscall
QPointingDevicePrivate::addPassiveGrabber
          (QPointingDevicePrivate *this,QPointerEvent *event,QEventPoint *point,QObject *grabber)

{
  QPointingDevice *this_00;
  bool bVar1;
  int iVar2;
  EventPointData *pEVar3;
  QDebug *pQVar4;
  long in_FS_OFFSET;
  QDebug QStack_98;
  QDebug local_90;
  QDebug local_88;
  QDebug local_80;
  undefined1 local_78 [20];
  undefined4 local_64;
  char *local_60;
  QDebug local_58;
  QEventPoint local_50;
  undefined1 local_48 [8];
  QObject *grabber_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPointingDevice **)&(this->super_QInputDevicePrivate).field_0x8;
  grabber_local = grabber;
  iVar2 = QEventPoint::id(point);
  pEVar3 = queryPointById(this,iVar2);
  if (pEVar3 == (EventPointData *)0x0) {
    local_78._0_4_ = 2;
    local_64 = 0;
    local_78._4_8_ = 0;
    local_78._12_8_ = 0;
    local_60 = "default";
    QMessageLogger::warning();
    pQVar4 = QDebug::operator<<(&local_58,"point is not in activePoints");
    local_50.d.d.ptr = (QExplicitlySharedDataPointer<QEventPointPrivate>)pQVar4->stream;
    *(int *)((long)local_50.d.d.ptr + 0x28) = *(int *)((long)local_50.d.d.ptr + 0x28) + 1;
    ::operator<<((Stream *)local_48,&local_50);
    QDebug::~QDebug((QDebug *)local_48);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug(&local_58);
  }
  else {
    bVar1 = QListSpecialMethodsBase<QPointer<QObject>>::contains<QObject*>
                      ((QListSpecialMethodsBase<QPointer<QObject>> *)&pEVar3->passiveGrabbers,
                       &grabber_local);
    if (!bVar1) {
      QtPrivateLogging::lcPointerGrab();
      if (((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value.
                 _M_base._M_i & 1) != 0) {
        QtPrivateLogging::lcPointerGrab();
        if (((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value.
                   _M_base._M_i & 1) != 0) {
          local_78._0_4_ = 2;
          local_78._4_8_ = 0;
          local_78._12_8_ = 0;
          local_64 = 0;
          local_60 = QtPrivateLogging::lcPointerGrab::category.name;
          QMessageLogger::debug();
          pQVar4 = QDebug::operator<<(&QStack_98,&(this->super_QInputDevicePrivate).name);
          pQVar4 = QDebug::operator<<(pQVar4,"point");
          iVar2 = QEventPoint::id(point);
          pQVar4 = QDebug::operator<<(pQVar4,iVar2);
          local_90.stream = pQVar4->stream;
          (local_90.stream)->ref = (local_90.stream)->ref + 1;
          QEventPoint::state(point);
          ::operator<<((Stream *)&local_58,(State)&local_90);
          pQVar4 = QDebug::operator<<(&local_58,": grab (passive)");
          local_88.stream = pQVar4->stream;
          (local_88.stream)->ref = (local_88.stream)->ref + 1;
          ::operator<<((QDebug *)&local_80,(QObject *)&local_88);
          QDebug::~QDebug(&local_80);
          QDebug::~QDebug(&local_88);
          QDebug::~QDebug(&local_58);
          QDebug::~QDebug(&local_90);
          QDebug::~QDebug(&QStack_98);
        }
      }
      QPointer<QObject>::QPointer<void>((QPointer<QObject> *)local_78,grabber_local);
      QList<QPointer<QObject>>::emplaceBack<QPointer<QObject>>
                ((QList<QPointer<QObject>> *)&pEVar3->passiveGrabbers,(QPointer<QObject> *)local_78)
      ;
      QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)local_78);
      QPointingDevice::grabChanged(this_00,grabber_local,GrabPassive,event,point);
      bVar1 = true;
      goto LAB_002e352b;
    }
  }
  bVar1 = false;
LAB_002e352b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QPointingDevicePrivate::addPassiveGrabber(const QPointerEvent *event, const QEventPoint &point, QObject *grabber)
{
    Q_Q(QPointingDevice);
    auto persistentPoint = queryPointById(point.id());
    if (!persistentPoint) {
        qWarning() << "point is not in activePoints" << point;
        return false;
    }
    if (persistentPoint->passiveGrabbers.contains(grabber))
        return false;
    if (Q_UNLIKELY(lcPointerGrab().isDebugEnabled())) {
        qCDebug(lcPointerGrab) << name << "point" << point.id() << point.state()
                               << ": grab (passive)" << grabber;
    }
    persistentPoint->passiveGrabbers << grabber;
    emit q->grabChanged(grabber, QPointingDevice::GrabPassive, event, point);
    return true;
}